

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O3

int32_t repTextExtract(UText *ut,int64_t start,int64_t limit,UChar *dest,int32_t destCapacity,
                      UErrorCode *status)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int32_t iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  UnicodeString buffer;
  UnicodeString local_70;
  
  plVar1 = (long *)ut->context;
  iVar2 = (**(code **)(*plVar1 + 0x40))(plVar1);
  iVar5 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((destCapacity < 0) || (destCapacity != 0 && dest == (UChar *)0x0)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    if (limit < start) {
      *status = U_INDEX_OUTOFBOUNDS_ERROR;
      iVar5 = 0;
    }
    else {
      uVar7 = (ulong)iVar2;
      uVar6 = start;
      if ((long)uVar7 < start) {
        uVar6 = uVar7;
      }
      uVar6 = uVar6 & 0xffffffff;
      if (start < 0) {
        uVar6 = 0;
      }
      uVar9 = limit;
      if ((long)uVar7 < limit) {
        uVar9 = uVar7;
      }
      uVar7 = uVar9 & 0xffffffff;
      if (limit < 0) {
        uVar7 = 0;
      }
      iVar8 = (int)uVar7;
      if (((int)uVar6 < iVar2) &&
         (uVar3 = (**(code **)(*plVar1 + 0x48))(plVar1,uVar6), (uVar3 & 0xfc00) == 0xdc00)) {
        iVar4 = (**(code **)(*plVar1 + 0x50))(plVar1,uVar6);
        uVar6 = (ulong)((int)uVar6 - (uint)(iVar4 - 0x10000U < 0x100000));
      }
      if ((iVar8 < iVar2) &&
         (uVar3 = (**(code **)(*plVar1 + 0x48))(plVar1,uVar7), (uVar3 & 0xfc00) == 0xdc00)) {
        iVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,uVar7);
        iVar8 = iVar8 - (uint)(iVar2 - 0x10000U < 0x100000);
      }
      iVar4 = iVar8 - (int)uVar6;
      iVar2 = destCapacity + (int)uVar6;
      if (iVar4 <= destCapacity) {
        iVar2 = iVar8;
      }
      icu_63::UnicodeString::UnicodeString(&local_70,dest,0,destCapacity);
      (**(code **)(*plVar1 + 0x18))(plVar1,uVar6,iVar2,&local_70);
      repTextAccess(ut,(long)iVar2,'\x01');
      iVar5 = u_terminateUChars_63(dest,destCapacity,iVar4,status);
      icu_63::UnicodeString::~UnicodeString(&local_70);
    }
  }
  return iVar5;
}

Assistant:

static int32_t U_CALLCONV
repTextExtract(UText *ut,
               int64_t start, int64_t limit,
               UChar *dest, int32_t destCapacity,
               UErrorCode *status) {
    const Replaceable *rep=(const Replaceable *)ut->context;
    int32_t  length=rep->length();

    if(U_FAILURE(*status)) {
        return 0;
    }
    if(destCapacity<0 || (dest==NULL && destCapacity>0)) {
        *status=U_ILLEGAL_ARGUMENT_ERROR;
    }
    if(start>limit) {
        *status=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    int32_t  start32 = pinIndex(start, length);
    int32_t  limit32 = pinIndex(limit, length);

    // adjust start, limit if they point to trail half of surrogates
    if (start32<length && U16_IS_TRAIL(rep->charAt(start32)) &&
        U_IS_SUPPLEMENTARY(rep->char32At(start32))){
            start32--;
    }
    if (limit32<length && U16_IS_TRAIL(rep->charAt(limit32)) &&
        U_IS_SUPPLEMENTARY(rep->char32At(limit32))){
            limit32--;
    }

    length=limit32-start32;
    if(length>destCapacity) {
        limit32 = start32 + destCapacity;
    }
    UnicodeString buffer(dest, 0, destCapacity); // writable alias
    rep->extractBetween(start32, limit32, buffer);
    repTextAccess(ut, limit32, TRUE);

    return u_terminateUChars(dest, destCapacity, length, status);
}